

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24db74::SerialQueueImpl::addOperation
          (SerialQueueImpl *this,function<void_()> *fn)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->operationsMutex);
  if (iVar1 == 0) {
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&this->operations,fn);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&this->operationsMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addOperation(std::function<void(void)>&& fn) {
    std::lock_guard<std::mutex> guard(operationsMutex);
    operations.push_back(fn);
    readyOperationsCondition.notify_one();
  }